

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O3

err_t MATROSKA_BlockReleaseData(matroska_block *Block,bool_t IncludingNotRead)

{
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  
  if ((IncludingNotRead != 0) || (Block->GlobalTimestamp != 0x7fffffffffffffff)) {
    ArrayClear(&Block->Data);
    (Block->Base).Base.bValueIsSet = '\0';
    uVar1 = (Block->SizeListIn)._Used;
    if (3 < uVar1) {
      if (3 < ((Block->SizeList)._Used ^ uVar1)) {
        __assert_fail("ARRAYCOUNT(Block->SizeListIn,int32_t) == ARRAYCOUNT(Block->SizeList,int32_t)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x3b1,"err_t MATROSKA_BlockReleaseData(matroska_block *, bool_t)");
      }
      pcVar2 = (Block->SizeList)._Begin;
      pcVar3 = (Block->SizeListIn)._Begin;
      uVar4 = 0;
      do {
        *(undefined4 *)(pcVar2 + uVar4) = *(undefined4 *)(pcVar3 + uVar4);
        uVar4 = uVar4 + 4;
      } while ((uVar1 & 0xfffffffffffffffc) != uVar4);
      ArrayClear(&Block->SizeListIn);
    }
  }
  return 0;
}

Assistant:

err_t MATROSKA_BlockReleaseData(matroska_block *Block, bool_t IncludingNotRead)
{
    if (!IncludingNotRead && Block->GlobalTimestamp==INVALID_TIMESTAMP_T)
        return ERR_NONE;
    ArrayClear(&Block->Data);
    Block->Base.Base.bValueIsSet = 0;
    if (ARRAYCOUNT(Block->SizeListIn,int32_t))
    {
        // recover the size of each lace in SizeList for later reading
        int32_t *i,*o;
        assert(ARRAYCOUNT(Block->SizeListIn,int32_t) == ARRAYCOUNT(Block->SizeList,int32_t));
        for (i=ARRAYBEGIN(Block->SizeListIn,int32_t),o=ARRAYBEGIN(Block->SizeList,int32_t);i!=ARRAYEND(Block->SizeListIn,int32_t);++i,++o)
            *o = *i;
        ArrayClear(&Block->SizeListIn);
    }
    return ERR_NONE;
}